

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawSpanMaskedPalCommand::Execute(DrawSpanMaskedPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  dsfixed_t dVar3;
  dsfixed_t dVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  byte bVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  dsfixed_t dVar15;
  int iVar16;
  
  iVar1 = (this->super_PalSpanCommand)._y;
  if (((thread->pass_start_y <= iVar1) && (iVar1 < thread->pass_end_y)) &&
     (iVar1 % thread->num_cores == thread->core)) {
    puVar5 = (this->super_PalSpanCommand)._source;
    puVar6 = (this->super_PalSpanCommand)._colormap;
    dVar15 = (this->super_PalSpanCommand)._xfrac;
    uVar14 = (this->super_PalSpanCommand)._yfrac;
    iVar2 = (this->super_PalSpanCommand)._x1;
    iVar10 = (&ylookup)[iVar1] + iVar2;
    iVar16 = ((this->super_PalSpanCommand)._x2 - iVar2) + 1;
    dVar3 = (this->super_PalSpanCommand)._xstep;
    dVar4 = (this->super_PalSpanCommand)._ystep;
    iVar1 = (this->super_PalSpanCommand)._xbits;
    iVar2 = (this->super_PalSpanCommand)._ybits;
    puVar7 = (this->super_PalSpanCommand)._destorg;
    if (iVar2 == 6 && iVar1 == 6) {
      lVar12 = 0;
      do {
        uVar13 = (ulong)puVar5[uVar14 >> 0x1a | dVar15 >> 0x14 & 0xffffffc0];
        if (uVar13 != 0) {
          puVar7[lVar12 + iVar10] = puVar6[uVar13];
        }
        dVar15 = dVar15 + dVar3;
        uVar14 = uVar14 + dVar4;
        lVar12 = lVar12 + 1;
      } while (iVar16 != (int)lVar12);
    }
    else {
      bVar9 = (byte)iVar2;
      bVar8 = 0x20 - bVar9;
      bVar11 = (byte)iVar1;
      lVar12 = 0;
      do {
        uVar13 = (ulong)puVar5[(int)((uVar14 >> (bVar8 & 0x1f)) +
                                    (dVar15 >> (bVar8 - bVar11 & 0x1f) &
                                    ~(-1 << (bVar11 & 0x1f)) << (bVar9 & 0x1f)))];
        if (uVar13 != 0) {
          puVar7[lVar12 + iVar10] = puVar6[uVar13];
        }
        dVar15 = dVar15 + dVar3;
        uVar14 = uVar14 + dVar4;
        lVar12 = lVar12 + 1;
      } while (iVar16 != (int)lVar12);
    }
  }
  return;
}

Assistant:

void DrawSpanMaskedPalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(_y))
			return;

		dsfixed_t xfrac;
		dsfixed_t yfrac;
		dsfixed_t xstep;
		dsfixed_t ystep;
		uint8_t *dest;
		const uint8_t *source = _source;
		const uint8_t *colormap = _colormap;
		int count;
		int spot;

		xfrac = _xfrac;
		yfrac = _yfrac;

		dest = ylookup[_y] + _x1 + _destorg;

		count = _x2 - _x1 + 1;

		xstep = _xstep;
		ystep = _ystep;

		if (_xbits == 6 && _ybits == 6)
		{
			// 64x64 is the most common case by far, so special case it.
			do
			{
				int texdata;

				spot = ((xfrac >> (32 - 6 - 6))&(63 * 64)) + (yfrac >> (32 - 6));
				texdata = source[spot];
				if (texdata != 0)
				{
					*dest = colormap[texdata];
				}
				dest++;
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
		else
		{
			uint8_t yshift = 32 - _ybits;
			uint8_t xshift = yshift - _xbits;
			int xmask = ((1 << _xbits) - 1) << _ybits;
			do
			{
				int texdata;

				spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);
				texdata = source[spot];
				if (texdata != 0)
				{
					*dest = colormap[texdata];
				}
				dest++;
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
	}